

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::FillerParameter::SharedCtor(FillerParameter *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value;
  FillerParameter *this_local;
  
  this->_cached_size_ = 0;
  default_value =
       google::protobuf::internal::
       ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)_default_type__abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->type_,default_value);
  memset(&this->value_,0,0x10);
  this->sparse_ = -1;
  this->max_ = 1.0;
  this->std_ = 1.0;
  return;
}

Assistant:

void FillerParameter::SharedCtor() {
  _cached_size_ = 0;
  type_.UnsafeSetDefault(&FillerParameter::_default_type_.get());
  ::memset(&value_, 0, reinterpret_cast<char*>(&variance_norm_) -
    reinterpret_cast<char*>(&value_) + sizeof(variance_norm_));
  sparse_ = -1;
  max_ = 1;
  std_ = 1;
}